

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidRandomUniformDistributionWrongMinMax(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *this;
  RandomUniformLikeLayerParams *pRVar7;
  ostream *poVar8;
  string *psVar9;
  long lVar10;
  RandomUniformStaticLayerParams *this_00;
  RandomUniformDynamicLayerParams *pRVar11;
  int iVar12;
  char *pcVar13;
  Model m;
  Result res3;
  Result res2;
  Result res1;
  
  CoreML::Specification::Model::Model(&m);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"output");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pNVar6 = CoreML::Specification::Model::mutable_neuralnetwork(&m);
  pNVar6->arrayinputshapemapping_ = 1;
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"output");
  pRVar7 = CoreML::Specification::NeuralNetworkLayer::mutable_randomuniformlike(this);
  pRVar7->minval_ = 1.2;
  pRVar7->maxval_ = 0.4;
  CoreML::validate<(MLModelType)500>(&res1,&m);
  bVar1 = CoreML::Result::good(&res1);
  if (bVar1) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x162b);
    poVar8 = std::operator<<(poVar8,": error: ");
    pcVar13 = "!((res1).good())";
  }
  else {
    psVar9 = CoreML::Result::message_abi_cxx11_(&res1);
    lVar10 = std::__cxx11::string::find((char *)psVar9,0x296c44);
    if (lVar10 != -1) {
      this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_randomuniformstatic(this);
      CoreML::Specification::RandomUniformStaticLayerParams::add_outputshape(this_00,3);
      this_00->minval_ = 1.2;
      this_00->maxval_ = 0.4;
      CoreML::validate<(MLModelType)500>(&res2,&m);
      bVar1 = CoreML::Result::good(&res2);
      if (bVar1) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar8 = std::operator<<(poVar8,":");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1634);
        poVar8 = std::operator<<(poVar8,": error: ");
        pcVar13 = "!((res2).good())";
LAB_0015a4a6:
        poVar8 = std::operator<<(poVar8,pcVar13);
        poVar8 = std::operator<<(poVar8," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar12 = 1;
      }
      else {
        psVar9 = CoreML::Result::message_abi_cxx11_(&res2);
        lVar10 = std::__cxx11::string::find((char *)psVar9,0x296c44);
        if (lVar10 == -1) {
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar8 = std::operator<<(poVar8,":");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1635);
          poVar8 = std::operator<<(poVar8,": error: ");
          pcVar13 = "res2.message().find(\"smaller\") != std::string::npos";
          goto LAB_0015a4a6;
        }
        pRVar11 = CoreML::Specification::NeuralNetworkLayer::mutable_randomuniformdynamic(this);
        pRVar11->minval_ = 1.2;
        pRVar11->maxval_ = 0.4;
        CoreML::validate<(MLModelType)500>(&res3,&m);
        bVar1 = CoreML::Result::good(&res3);
        if (bVar1) {
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar8 = std::operator<<(poVar8,":");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x163c);
          poVar8 = std::operator<<(poVar8,": error: ");
          pcVar13 = "!((res3).good())";
LAB_0015a535:
          poVar8 = std::operator<<(poVar8,pcVar13);
          poVar8 = std::operator<<(poVar8," was false, expected true.");
          std::endl<char,std::char_traits<char>>(poVar8);
          iVar12 = 1;
        }
        else {
          psVar9 = CoreML::Result::message_abi_cxx11_(&res3);
          iVar12 = 0;
          lVar10 = std::__cxx11::string::find((char *)psVar9,0x296c44);
          if (lVar10 == -1) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar8 = std::operator<<(poVar8,":");
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x163d);
            poVar8 = std::operator<<(poVar8,": error: ");
            pcVar13 = "res3.message().find(\"smaller\") != std::string::npos";
            goto LAB_0015a535;
          }
        }
        std::__cxx11::string::~string((string *)&res3.m_message);
      }
      std::__cxx11::string::~string((string *)&res2.m_message);
      goto LAB_0015a56b;
    }
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x162c);
    poVar8 = std::operator<<(poVar8,": error: ");
    pcVar13 = "res1.message().find(\"smaller\") != std::string::npos";
  }
  poVar8 = std::operator<<(poVar8,pcVar13);
  poVar8 = std::operator<<(poVar8," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar8);
  iVar12 = 1;
LAB_0015a56b:
  std::__cxx11::string::~string((string *)&res1.m_message);
  CoreML::Specification::Model::~Model(&m);
  return iVar12;
}

Assistant:

int testInvalidRandomUniformDistributionWrongMinMax() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // value of minval should be smaller than value of maxval

    auto* params1 = layers->mutable_randomuniformlike();
    params1->set_minval(1.2f);
    params1->set_maxval(0.4f);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("smaller") != std::string::npos);

    auto* params2 = layers->mutable_randomuniformstatic();
    params2->add_outputshape(3);
    params2->set_minval(1.2f);
    params2->set_maxval(0.4f);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("smaller") != std::string::npos);

    auto* params3 = layers->mutable_randomuniformdynamic();
    params3->set_minval(1.2f);
    params3->set_maxval(0.4f);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("smaller") != std::string::npos);

    return 0;
}